

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matras.c
# Opt level: O2

void * matras_alloc(matras *m,matras_id_t *result_id)

{
  ulong uVar1;
  size_t sVar2;
  void *pvVar3;
  
  uVar1 = (m->head).block_count;
  if (m->capacity < uVar1) {
    __assert_fail("m->head.block_count <= m->capacity",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/matras.c"
                  ,0xf7,"void *matras_alloc(struct matras *, matras_id_t *)");
  }
  if ((uVar1 != m->capacity) && (pvVar3 = matras_alloc_internal(m), pvVar3 != (void *)0x0)) {
    sVar2 = (m->head).block_count;
    (m->head).block_count = sVar2 + 1;
    *result_id = (matras_id_t)sVar2;
    return pvVar3;
  }
  return (void *)0x0;
}

Assistant:

void *
matras_alloc(struct matras *m, matras_id_t *result_id)
{
	assert(m->head.block_count <= m->capacity);

	if (m->head.block_count == m->capacity) {
		/* Matras is completely full. */
		return NULL;
	}
	void *res = matras_alloc_internal(m);
	if (res != NULL)
		*result_id = m->head.block_count++;
	return res;
}